

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

_Bool duckdb_je_multi_setting_parse_next
                (char **setting_segment_cur,size_t *len_left,size_t *key_start,size_t *key_end,
                size_t *value)

{
  char *nptr;
  uintmax_t *puVar1;
  int *piVar2;
  uintmax_t uVar3;
  _Bool _Var4;
  char *end;
  char *local_40;
  uintmax_t *local_38;
  
  nptr = *setting_segment_cur;
  local_38 = value;
  piVar2 = __errno_location();
  *piVar2 = 0;
  uVar3 = duckdb_je_malloc_strtoumax(nptr,&local_40,0);
  puVar1 = local_38;
  _Var4 = true;
  if (*piVar2 == 0) {
    if (*local_40 == '-') {
      *key_start = uVar3;
      uVar3 = duckdb_je_malloc_strtoumax(local_40 + 1,&local_40,0);
      if ((*piVar2 == 0) && (*local_40 == ':')) {
        *key_end = uVar3;
        uVar3 = duckdb_je_malloc_strtoumax(local_40 + 1,&local_40,0);
        if (*piVar2 == 0) {
          *puVar1 = uVar3;
          if (*local_40 == '|') {
            local_40 = local_40 + 1;
          }
          *len_left = (size_t)(*setting_segment_cur + (*len_left - (long)local_40));
          *setting_segment_cur = local_40;
          _Var4 = false;
        }
      }
    }
  }
  return _Var4;
}

Assistant:

bool
multi_setting_parse_next(const char **setting_segment_cur, size_t *len_left,
    size_t *key_start, size_t *key_end, size_t *value) {
	const char *cur = *setting_segment_cur;
	char *end;
	uintmax_t um;

	set_errno(0);

	/* First number, then '-' */
	um = malloc_strtoumax(cur, &end, 0);
	if (get_errno() != 0 || *end != '-') {
		return true;
	}
	*key_start = (size_t)um;
	cur = end + 1;

	/* Second number, then ':' */
	um = malloc_strtoumax(cur, &end, 0);
	if (get_errno() != 0 || *end != ':') {
		return true;
	}
	*key_end = (size_t)um;
	cur = end + 1;

	/* Last number */
	um = malloc_strtoumax(cur, &end, 0);
	if (get_errno() != 0) {
		return true;
	}
	*value = (size_t)um;

	/* Consume the separator if there is one. */
	if (*end == '|') {
		end++;
	}

	*len_left -= end - *setting_segment_cur;
	*setting_segment_cur = end;

	return false;
}